

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall icu_63::number::impl::DecimalQuantity::compact(DecimalQuantity *this)

{
  char *pcVar1;
  uint uVar2;
  int8_t iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if (this->usingBytes == true) {
    uVar2 = this->precision;
    uVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      if ((this->fBCD).bcdBytes.ptr[uVar4] != '\0') {
        uVar5 = uVar4 & 0xffffffff;
        break;
      }
    }
    if ((uint)uVar5 != uVar2) {
      shiftRight(this,(uint)uVar5);
      uVar4 = (ulong)(uint)this->precision + 1;
      do {
        if ((int)uVar4 + -1 < 1) {
          this->precision = (int)uVar4 + -1;
          goto LAB_00212631;
        }
        uVar5 = uVar4 - 1;
        pcVar1 = (char *)(((this->fBCD).bcdLong - 2) + uVar4);
        uVar4 = uVar5;
      } while (*pcVar1 == '\0');
      this->precision = (int32_t)uVar5;
      if (0x10 < uVar5) {
        return;
      }
LAB_00212631:
      switchStorage(this);
      return;
    }
  }
  else {
    uVar4 = (this->fBCD).bcdLong;
    if (uVar4 != 0) {
      uVar2 = this->precision;
      uVar6 = 0;
      uVar8 = 0;
      if (0 < (int)uVar2) {
        uVar6 = uVar2;
        uVar8 = 0;
      }
      while ((uVar7 = uVar6, uVar6 != uVar8 &&
             (iVar3 = getDigitPos(this,uVar8), uVar7 = uVar8, iVar3 == '\0'))) {
        uVar8 = uVar8 + 1;
      }
      (this->fBCD).bcdLong = uVar4 >> ((char)uVar7 * '\x04' & 0x3fU);
      this->scale = this->scale + uVar7;
      uVar6 = uVar2;
      do {
        uVar7 = uVar6;
        uVar8 = (int)uVar2 >> 0x1f & uVar2;
        if ((int)uVar7 < 1) break;
        iVar3 = getDigitPos(this,uVar7 - 1);
        uVar6 = uVar7 - 1;
        uVar8 = uVar7;
      } while (iVar3 == '\0');
      this->precision = uVar8;
      return;
    }
  }
  setBcdToZero(this);
  return;
}

Assistant:

void DecimalQuantity::compact() {
    if (usingBytes) {
        int32_t delta = 0;
        for (; delta < precision && fBCD.bcdBytes.ptr[delta] == 0; delta++);
        if (delta == precision) {
            // Number is zero
            setBcdToZero();
            return;
        } else {
            // Remove trailing zeros
            shiftRight(delta);
        }

        // Compute precision
        int32_t leading = precision - 1;
        for (; leading >= 0 && fBCD.bcdBytes.ptr[leading] == 0; leading--);
        precision = leading + 1;

        // Switch storage mechanism if possible
        if (precision <= 16) {
            switchStorage();
        }

    } else {
        if (fBCD.bcdLong == 0L) {
            // Number is zero
            setBcdToZero();
            return;
        }

        // Compact the number (remove trailing zeros)
        // TODO: Use a more efficient algorithm here and below. There is a logarithmic one.
        int32_t delta = 0;
        for (; delta < precision && getDigitPos(delta) == 0; delta++);
        fBCD.bcdLong >>= delta * 4;
        scale += delta;

        // Compute precision
        int32_t leading = precision - 1;
        for (; leading >= 0 && getDigitPos(leading) == 0; leading--);
        precision = leading + 1;
    }
}